

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::a64::PrologEpilogInfo::init(PrologEpilogInfo *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  BitWordIterator<unsigned_int> it;
  uint32_t savedRegs;
  uint32_t slotSize;
  RegPair *pairs;
  uint32_t pairCount;
  uint32_t n;
  GroupData *data;
  RegGroup group;
  Iterator __end3;
  Iterator __begin3;
  EnumValues<asmjit::v1_14::RegGroup,_(asmjit::v1_14::RegGroup)0,_(asmjit::v1_14::RegGroup)1>
  *__range3;
  uint32_t offset;
  char *in_stack_000002f0;
  int in_stack_000002fc;
  char *in_stack_00000300;
  RegGroup *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  RegGroup group_00;
  RegMask local_f0 [2];
  uint local_e8;
  uint32_t local_e4;
  GroupData *local_e0;
  uint local_d8;
  uint local_d4;
  GroupData *local_d0;
  RegGroup local_c4;
  RegGroup local_c3;
  RegGroup local_c2;
  undefined1 local_c1;
  undefined1 *local_c0;
  uint32_t local_b4;
  EVP_PKEY_CTX *local_b0;
  PrologEpilogInfo *local_a8;
  undefined1 *local_a0;
  undefined1 local_91;
  undefined1 *local_90;
  undefined1 local_81;
  RegGroup *local_80;
  RegGroup *local_78;
  RegGroup *local_70;
  EVP_PKEY_CTX *local_68;
  RegGroup *local_60;
  undefined4 local_54;
  RegMask *local_50;
  RegMask local_44;
  RegMask *local_40;
  RegMask *local_38;
  undefined4 *local_30;
  RegMask *local_28;
  RegMask *local_20;
  undefined4 *local_18;
  undefined4 local_c;
  EVP_PKEY_CTX *local_8;
  
  local_b4 = 0;
  local_c0 = &local_c1;
  local_91 = 0;
  local_c2 = k0;
  local_81 = 2;
  local_c3 = kMask;
  local_b0 = ctx;
  local_a8 = this;
  local_a0 = local_c0;
  local_90 = local_c0;
  do {
    local_78 = &local_c2;
    local_80 = &local_c3;
    if (local_c2 == local_c3) {
      this->sizeTotal = local_b4;
      return 0;
    }
    local_70 = &local_c2;
    local_c4 = local_c2;
    group_00 = local_c2;
    local_e0 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
               operator[]<asmjit::v1_14::RegGroup>
                         ((Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL> *)
                          CONCAT17(local_c2,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
    local_d4 = 0;
    local_d8 = 0;
    local_d0 = local_e0;
    local_e4 = FuncFrame::saveRestoreRegSize((FuncFrame *)this,group_00);
    local_e8 = FuncFrame::savedRegs((FuncFrame *)this,group_00);
    if (local_c4 == k0) {
      local_68 = local_b0;
      local_8 = local_b0;
      local_c = 0x10;
      bVar1 = Support::test<asmjit::v1_14::FuncAttributes,asmjit::v1_14::FuncAttributes>
                        (*(FuncAttributes *)local_b0,kHasPreservedFP);
      if (bVar1) {
        if (local_d8 != 0) {
          DebugUtils::assertionFailed(in_stack_00000300,in_stack_000002fc,in_stack_000002f0);
        }
        local_e0->pairs[0].offset = (uint16_t)local_b4;
        local_e0->pairs[0].ids[0] = '\x1d';
        local_e0->pairs[0].ids[1] = '\x1e';
        local_b4 = local_e4 * 2 + local_b4;
        local_d8 = 1;
        local_f0[1] = 0x1d;
        local_50 = local_f0 + 1;
        local_54 = 0x1e;
        local_30 = &local_54;
        local_e8 = local_e8 & 0x9fffffff;
        local_28 = local_50;
        local_20 = local_50;
        local_18 = local_30;
      }
    }
    local_40 = local_f0;
    local_44 = local_e8;
    local_f0[0] = local_e8;
    while (local_38 = local_f0, local_f0[0] != 0) {
      uVar2 = Support::BitWordIterator<unsigned_int>::next((BitWordIterator<unsigned_int> *)this);
      local_e0->pairs[local_d8].ids[local_d4] = (uint8_t)uVar2;
      local_d4 = local_d4 + 1;
      if (local_d4 == 2) {
        local_e0->pairs[local_d8].offset = (uint16_t)local_b4;
        local_b4 = local_e4 * 2 + local_b4;
        local_d4 = 0;
        local_d8 = local_d8 + 1;
      }
    }
    if (local_d4 == 1) {
      local_e0->pairs[local_d8].ids[1] = 0xff;
      local_e0->pairs[local_d8].offset = (uint16_t)local_b4;
      local_b4 = local_e4 * 2 + local_b4;
      local_d8 = local_d8 + 1;
    }
    local_d0->pairCount = local_d8;
    local_60 = &local_c2;
    local_c2 = local_c2 + kVec;
  } while( true );
}

Assistant:

Error init(const FuncFrame& frame) noexcept {
    uint32_t offset = 0;

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup::kGp, RegGroup::kVec>{}) {
      GroupData& data = groups[group];

      uint32_t n = 0;
      uint32_t pairCount = 0;
      RegPair* pairs = data.pairs;

      uint32_t slotSize = frame.saveRestoreRegSize(group);
      uint32_t savedRegs = frame.savedRegs(group);

      if (group == RegGroup::kGp && frame.hasPreservedFP()) {
        // Must be at the beginning of the push/pop sequence.
        ASMJIT_ASSERT(pairCount == 0);

        pairs[0].offset = uint16_t(offset);
        pairs[0].ids[0] = Gp::kIdFp;
        pairs[0].ids[1] = Gp::kIdLr;
        offset += slotSize * 2;
        pairCount++;

        savedRegs &= ~Support::bitMask(Gp::kIdFp, Gp::kIdLr);
      }

      Support::BitWordIterator<uint32_t> it(savedRegs);
      while (it.hasNext()) {
        pairs[pairCount].ids[n] = uint8_t(it.next());

        if (++n == 2) {
          pairs[pairCount].offset = uint16_t(offset);
          offset += slotSize * 2;

          n = 0;
          pairCount++;
        }
      }

      if (n == 1) {
        pairs[pairCount].ids[1] = uint8_t(BaseReg::kIdBad);
        pairs[pairCount].offset = uint16_t(offset);
        offset += slotSize * 2;
        pairCount++;
      }

      data.pairCount = pairCount;
    }

    sizeTotal = offset;
    return kErrorOk;
  }